

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Id __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::CreateInvocationsVectorOperation
          (TGlslangToSpvTraverser *this,Op op,GroupOperation groupOperation,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands)

{
  Builder *this_00;
  Instruction *pIVar1;
  uint uVar2;
  Id IVar3;
  IdImmediate *__x;
  uint uVar4;
  IdImmediate operand;
  IdImmediate scalar;
  IdImmediate groupOp;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> spvGroupOperands;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> results;
  
  if ((((7 < op - OpGroupIAdd) && (7 < op - OpGroupIAddNonUniformAMD)) &&
      (op != OpSubgroupFirstInvocationKHR)) && (op != OpSubgroupReadInvocationKHR)) {
    __assert_fail("op == spv::OpGroupFMin || op == spv::OpGroupUMin || op == spv::OpGroupSMin || op == spv::OpGroupFMax || op == spv::OpGroupUMax || op == spv::OpGroupSMax || op == spv::OpGroupFAdd || op == spv::OpGroupIAdd || op == spv::OpGroupBroadcast || op == spv::OpSubgroupReadInvocationKHR || op == spv::OpSubgroupFirstInvocationKHR || op == spv::OpGroupFMinNonUniformAMD || op == spv::OpGroupUMinNonUniformAMD || op == spv::OpGroupSMinNonUniformAMD || op == spv::OpGroupFMaxNonUniformAMD || op == spv::OpGroupUMaxNonUniformAMD || op == spv::OpGroupSMaxNonUniformAMD || op == spv::OpGroupFAddNonUniformAMD || op == spv::OpGroupIAddNonUniformAMD"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x21e5,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::CreateInvocationsVectorOperation(spv::Op, spv::GroupOperation, spv::Id, std::vector<spv::Id> &)"
                 );
  }
  this_00 = &this->builder;
  uVar2 = spv::Builder::getNumComponents
                    (this_00,*(operands->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start);
  pIVar1 = (this->builder).module.idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start
           [*(operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start];
  uVar4 = 0;
  IVar3 = 0;
  if (pIVar1 != (Instruction *)0x0) {
    IVar3 = pIVar1->typeId;
  }
  IVar3 = spv::Builder::getScalarTypeId(this_00,IVar3);
  results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(spvGroupOperands.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,uVar4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&indexes,(uint *)&spvGroupOperands.
                                 super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>
              );
    scalar.word = spv::Builder::createCompositeExtract
                            (this_00,*(operands->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_start,IVar3,&indexes);
    scalar.isId = true;
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (op == OpSubgroupFirstInvocationKHR) {
      std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                 &spvGroupOperands.
                  super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>,&scalar);
    }
    else {
      if (op == OpSubgroupReadInvocationKHR) {
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                   &spvGroupOperands.
                    super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>,&scalar)
        ;
        operand.word = (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start[1];
        operand.isId = true;
        __x = &operand;
      }
      else {
        operand.word = spv::Builder::makeUintConstant(this_00,3,false);
        operand.isId = true;
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                   &spvGroupOperands.
                    super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>,&operand
                  );
        groupOp.isId = false;
        groupOp.word = groupOperation;
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                   &spvGroupOperands.
                    super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>,&groupOp
                  );
        __x = &scalar;
      }
      std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                 &spvGroupOperands.
                  super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>,__x);
    }
    operand._0_4_ =
         spv::Builder::createOp
                   (this_00,op,IVar3,
                    (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                    &spvGroupOperands.
                     super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&results,(uint *)&operand);
    std::_Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::~_Vector_base
              (&spvGroupOperands.
                super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  IVar3 = spv::Builder::createCompositeConstruct
                    (this_00,typeId,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return IVar3;
}

Assistant:

spv::Id TGlslangToSpvTraverser::CreateInvocationsVectorOperation(spv::Op op, spv::GroupOperation groupOperation,
    spv::Id typeId, std::vector<spv::Id>& operands)
{
    assert(op == spv::OpGroupFMin || op == spv::OpGroupUMin || op == spv::OpGroupSMin ||
           op == spv::OpGroupFMax || op == spv::OpGroupUMax || op == spv::OpGroupSMax ||
           op == spv::OpGroupFAdd || op == spv::OpGroupIAdd || op == spv::OpGroupBroadcast ||
           op == spv::OpSubgroupReadInvocationKHR || op == spv::OpSubgroupFirstInvocationKHR ||
           op == spv::OpGroupFMinNonUniformAMD || op == spv::OpGroupUMinNonUniformAMD ||
           op == spv::OpGroupSMinNonUniformAMD ||
           op == spv::OpGroupFMaxNonUniformAMD || op == spv::OpGroupUMaxNonUniformAMD ||
           op == spv::OpGroupSMaxNonUniformAMD ||
           op == spv::OpGroupFAddNonUniformAMD || op == spv::OpGroupIAddNonUniformAMD);

    // Handle group invocation operations scalar by scalar.
    // The result type is the same type as the original type.
    // The algorithm is to:
    //   - break the vector into scalars
    //   - apply the operation to each scalar
    //   - make a vector out the scalar results

    // get the types sorted out
    int numComponents = builder.getNumComponents(operands[0]);
    spv::Id scalarType = builder.getScalarTypeId(builder.getTypeId(operands[0]));
    std::vector<spv::Id> results;

    // do each scalar op
    for (int comp = 0; comp < numComponents; ++comp) {
        std::vector<unsigned int> indexes;
        indexes.push_back(comp);
        spv::IdImmediate scalar = { true, builder.createCompositeExtract(operands[0], scalarType, indexes) };
        std::vector<spv::IdImmediate> spvGroupOperands;
        if (op == spv::OpSubgroupReadInvocationKHR) {
            spvGroupOperands.push_back(scalar);
            spv::IdImmediate operand = { true, operands[1] };
            spvGroupOperands.push_back(operand);
        } else if (op == spv::OpSubgroupFirstInvocationKHR) {
            spvGroupOperands.push_back(scalar);
        } else if (op == spv::OpGroupBroadcast) {
            spv::IdImmediate scope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
            spvGroupOperands.push_back(scope);
            spvGroupOperands.push_back(scalar);
            spv::IdImmediate operand = { true, operands[1] };
            spvGroupOperands.push_back(operand);
        } else {
            spv::IdImmediate scope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
            spvGroupOperands.push_back(scope);
            spv::IdImmediate groupOp = { false, (unsigned)groupOperation };
            spvGroupOperands.push_back(groupOp);
            spvGroupOperands.push_back(scalar);
        }

        results.push_back(builder.createOp(op, scalarType, spvGroupOperands));
    }

    // put the pieces together
    return builder.createCompositeConstruct(typeId, results);
}